

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O3

void Diligent::ProcessIncludeErrorHandler(ShaderCreateInfo *ShaderCI,string *Error)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  string FileInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  if (ShaderCI->FilePath == (Char *)0x0) {
    if ((ShaderCI->Desc).super_DeviceObjectAttribs.Name == (Char *)0x0) goto LAB_0029d1fa;
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x6b4b75);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,0x6cf3ae);
  }
  std::__cxx11::string::append((char *)&local_38);
  std::__cxx11::string::push_back((char)&local_38);
LAB_0029d1fa:
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)__cxa_allocate_exception(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,&local_38,Error);
  __cxa_throw(this,&std::pair<std::__cxx11::string,std::__cxx11::string>::typeinfo,
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair);
}

Assistant:

static void ProcessIncludeErrorHandler(const ShaderCreateInfo& ShaderCI, const std::string& Error) noexcept(false)
{
    std::string FileInfo;
    if (ShaderCI.FilePath != nullptr)
    {
        FileInfo = "file '";
        FileInfo += ShaderCI.FilePath;
        FileInfo += '\'';
    }
    else if (ShaderCI.Desc.Name != nullptr)
    {
        FileInfo = "shader '";
        FileInfo += ShaderCI.Desc.Name;
        FileInfo += '\'';
    }
    throw std::pair<std::string, std::string>{std::move(FileInfo), Error};
}